

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRTrackerEvent.cpp
# Opt level: O0

float * __thiscall MinVR::VRTrackerEvent::getTransform(VRTrackerEvent *this)

{
  bool bVar1;
  VRFloatArray *pVVar2;
  const_reference pvVar3;
  undefined8 uVar4;
  string *in_RDI;
  int *unaff_retaddr;
  string *in_stack_00000008;
  string *in_stack_00000010;
  string *in_stack_00000018;
  VRError *in_stack_00000020;
  bool in_stack_00000047;
  string *in_stack_00000048;
  string *in_stack_00000050;
  VRDataIndex *in_stack_00000058;
  vector<float,_std::allocator<float>_> *v;
  VRDataIndex *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  allocator<char> *in_stack_fffffffffffffe20;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe28;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 inherit;
  undefined6 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe66;
  undefined1 in_stack_fffffffffffffe67;
  string *in_stack_fffffffffffffe68;
  VRDataIndex *in_stack_fffffffffffffe70;
  allocator<char> local_c1;
  string local_c0 [39];
  undefined1 local_99 [33];
  VRDatum_conflict *local_78;
  VRFloatArray *local_70;
  allocator<char> local_61;
  string local_60 [55];
  allocator<char> local_29;
  string local_28 [32];
  string *whereFunc;
  
  inherit = (undefined1)((ulong)&local_29 >> 0x38);
  whereFunc = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  bVar1 = VRDataIndex::exists(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                              (string *)
                              CONCAT17(in_stack_fffffffffffffe67,
                                       CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)
                                      ),(bool)inherit);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  if (!bVar1) {
    uVar4 = __cxa_allocate_exception(0xa8);
    VRDataIndex::getName_abi_cxx11_(in_stack_fffffffffffffde8);
    std::operator+((char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    std::operator+(in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    VRError::VRError(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                     unaff_retaddr,whereFunc);
    __cxa_throw(uVar4,&VRError::typeinfo,VRError::~VRError);
  }
  __s = (char *)in_RDI->_M_string_length;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,in_stack_fffffffffffffe20);
  __a = &local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  local_78 = (VRDatum_conflict *)
             VRDataIndex::getValue
                       (in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000047);
  pVVar2 = VRDatumConverter::operator_cast_to_vector_((VRDatumConverter<MinVR::VRDatum> *)0x192d9d);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)(local_99 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_99);
  local_70 = pVVar2;
  pvVar3 = std::vector<float,_std::allocator<float>_>::front
                     ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffdf0);
  return pvVar3;
}

Assistant:

const float * VRTrackerEvent::getTransform() const {
    if (_index.exists("Transform")) {
        const std::vector<float> *v = _index.getValue("Transform");
        return &(v->front());
    }
    else {
        VRERROR("VRTrackerEvent::getTransform() cannot determine a data field to return for event named " +
                _index.getName() + ".", "Tracker_Move events should have an entry in their data index called Transform.");
        return NULL;
    }
}